

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

void Gia_AigerWriteLut(Gia_Man_t *p,char *pFileName)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  undefined4 *__ptr;
  Vec_Wrd_t *vTruths;
  word *__s;
  Gia_Obj_t *pGVar9;
  int *piVar10;
  Gia_Obj_t *pGVar11;
  word wVar12;
  FILE *__s_00;
  int iVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  undefined4 *puVar17;
  int Var;
  size_t sVar18;
  int iVar19;
  
  iVar5 = Gia_ManLutSizeMax(p);
  Var = 1;
  iVar19 = 1 << ((char)iVar5 - 5U & 0x1f);
  if (iVar5 < 6) {
    iVar19 = 1;
  }
  iVar1 = p->vCis->nSize;
  iVar2 = p->vCos->nSize;
  iVar6 = Gia_ManLutNum(p);
  iVar7 = iVar6 + iVar1 + iVar2 + 1;
  __ptr = (undefined4 *)calloc((long)iVar7,0x54);
  iVar3 = p->nObjs;
  vTruths = (Vec_Wrd_t *)malloc(0x10);
  iVar13 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar13 = iVar3;
  }
  vTruths->nCap = iVar13;
  if (iVar13 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc((long)iVar13 << 3);
  }
  vTruths->pArray = __s;
  vTruths->nSize = iVar3;
  memset(__s,0,(long)iVar3 << 3);
  if (6 < iVar5) {
    __assert_fail("LutSizeMax <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                  ,0x7e7,"void Gia_AigerWriteLut(Gia_Man_t *, char *)");
  }
  *__ptr = 3;
  sVar18 = (long)iVar19 << 2;
  memset(__ptr + 0xd,0xff,sVar18);
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  puVar17 = __ptr;
  while( true ) {
    if (p->vCis->nSize <= Var + -1) break;
    pGVar9 = Gia_ManCi(p,Var + -1);
    if (pGVar9 == (Gia_Obj_t *)0x0) break;
    puVar17[0x15] = 1;
    memset(puVar17 + 0x22,0xaa,sVar18);
    uVar8 = Abc_Var2Lit(Var,0);
    puVar17[0x16] = uVar8;
    pGVar9->Value = uVar8;
    Var = Var + 1;
    puVar17 = puVar17 + 0x15;
  }
  iVar19 = 0;
  while( true ) {
    lVar15 = (long)Var;
    if (p->nObjs <= iVar19) break;
    pGVar9 = Gia_ManObj(p,iVar19);
    if (pGVar9 == (Gia_Obj_t *)0x0) break;
    if (iVar19 != 0) {
      iVar5 = Gia_ObjIsLut(p,iVar19);
      if (iVar5 != 0) {
        __ptr[lVar15 * 0x15] = 3;
        lVar16 = 0;
        while( true ) {
          iVar5 = Gia_ObjLutSize(p,iVar19);
          if (iVar5 <= lVar16) break;
          piVar10 = Gia_ObjLutFanins(p,iVar19);
          pGVar11 = Gia_ManObj(p,piVar10[lVar16]);
          __ptr[lVar15 * 0x15 + lVar16 + 5] = pGVar11->Value;
          lVar16 = lVar16 + 1;
        }
        __ptr[lVar15 * 0x15 + 3] = (int)lVar16;
        wVar12 = Gia_LutComputeTruth6(p,iVar19,vTruths);
        *(word *)(__ptr + lVar15 * 0x15 + 0xd) = wVar12;
        uVar8 = Abc_Var2Lit(Var,0);
        __ptr[lVar15 * 0x15 + 1] = uVar8;
        pGVar9->Value = uVar8;
        Var = Var + 1;
      }
    }
    iVar19 = iVar19 + 1;
  }
  puVar17 = __ptr + lVar15 * 0x15 + 0xd;
  for (iVar19 = 0; iVar19 < p->vCos->nSize; iVar19 = iVar19 + 1) {
    pGVar9 = Gia_ManCo(p,iVar19);
    if (pGVar9 == (Gia_Obj_t *)0x0) break;
    puVar17[-0xd] = 2;
    uVar4 = *(undefined8 *)pGVar9;
    uVar14 = (ulong)((uint)uVar4 & 0x1fffffff);
    puVar17[-8] = pGVar9[-uVar14].Value;
    if ((((uint)uVar4 >> 0x1d & 1) == 0) ==
        ((~*(ulong *)(pGVar9 + -uVar14) & 0x1fffffff1fffffff) == 0)) {
      iVar5 = 0x55;
    }
    else {
      iVar5 = 0xaa;
    }
    memset(puVar17,iVar5,sVar18);
    puVar17[-10] = 1;
    uVar8 = Abc_Var2Lit(iVar19 + Var,0);
    puVar17[-0xc] = uVar8;
    pGVar9->Value = uVar8;
    puVar17 = puVar17 + 0x15;
  }
  if (((iVar6 + iVar2 + iVar1) - Var) + 1 != iVar19) {
    __assert_fail("iLut == nLuts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                  ,0x810,"void Gia_AigerWriteLut(Gia_Man_t *, char *)");
  }
  __s_00 = fopen(pFileName,"wb");
  if (__s_00 == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for writing.\n",pFileName);
  }
  else {
    uVar8 = iVar7 * 0x54;
    sVar18 = fwrite(__ptr,1,(long)(int)uVar8,__s_00);
    if (uVar8 != (uint)sVar18) {
      __assert_fail("nSize1 == nSize2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                    ,0x81a,"void Gia_AigerWriteLut(Gia_Man_t *, char *)");
    }
    printf("Successfully dumped %d bytes of binary data.\n",(ulong)uVar8);
  }
  fclose(__s_00);
  free(__ptr);
  free(vTruths->pArray);
  free(vTruths);
  return;
}

Assistant:

void Gia_AigerWriteLut( Gia_Man_t * p, char * pFileName )
{
    Gia_Obj_t * pObj;
    int i, k, iFan, iLut = 0;
    int LutSizeMax = Gia_ManLutSizeMax( p );
    int nUints = Abc_TruthWordNum(LutSizeMax);
    int nLuts = 1 + Gia_ManCiNum(p) + Gia_ManCoNum(p) + Gia_ManLutNum(p);
    Gia_MapLut_t * pLuts = ABC_CALLOC( Gia_MapLut_t, nLuts );
    Vec_Wrd_t * vTruths = Vec_WrdStart( Gia_ManObjNum(p) );
    assert( LutSizeMax <= 6 );
    // set obj numbers
    // constant
    pLuts->Type = 3;
    memset( pLuts->pTruth, 0xFF, sizeof(unsigned) * nUints );
    Gia_ManFillValue(p);
    Gia_ManConst0(p)->Value = pLuts[iLut].Out = Abc_Var2Lit( iLut, 0 );
    iLut++;
    // inputs
    Gia_ManForEachCi( p, pObj, i )
    {
        pLuts[iLut].Type = 1;
        memset( pLuts[iLut].pTruth, 0xAA, sizeof(unsigned) * nUints );
        pObj->Value = pLuts[iLut].Out = Abc_Var2Lit( iLut, 0 );
        iLut++;
    }
    // nodes
    Gia_ManForEachObj( p, pObj, i )
        if ( i && Gia_ObjIsLut(p, i) )
        {
            pLuts[iLut].Type = 3;
            Gia_LutForEachFanin( p, i, iFan, k )
                pLuts[iLut].pFans[k] = Gia_ManObj(p, iFan)->Value;
            pLuts[iLut].nFans = k;
            *(word *)pLuts[iLut].pTruth = Gia_LutComputeTruth6(p, i, vTruths);
            pObj->Value = pLuts[iLut].Out = Abc_Var2Lit( iLut, 0 );
            iLut++;
        }
    // outputs
    Gia_ManForEachCo( p, pObj, i )
    {
        pLuts[iLut].Type = 2;
        pLuts[iLut].pFans[0] = Gia_ObjFanin0(pObj)->Value;
        if ( Gia_ObjFaninC0(pObj) ^ Gia_ObjIsConst0(Gia_ObjFanin0(pObj)) )
            memset( pLuts[iLut].pTruth, 0x55, sizeof(unsigned) * nUints );
        else
            memset( pLuts[iLut].pTruth, 0xAA, sizeof(unsigned) * nUints );
        pLuts[iLut].nFans = 1;
        pObj->Value = pLuts[iLut].Out = Abc_Var2Lit( iLut, 0 );
        iLut++;
    }
    assert( iLut == nLuts );
    // dump into a file
    {
        FILE * pFile = fopen( pFileName, "wb" );
        if ( pFile == NULL )
            printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        else
        {
            int nSize1 = nLuts * sizeof(Gia_MapLut_t);
            int nSize2 = fwrite( pLuts, 1, nSize1, pFile );
            assert( nSize1 == nSize2 );
            printf( "Successfully dumped %d bytes of binary data.\n", nSize1 );
        }
        fclose( pFile );
    }
    ABC_FREE( pLuts );
    Vec_WrdFree( vTruths );
}